

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O0

void handle_fp_compare(DisasContext_conflict1 *s,int size,uint rn,uint rm,_Bool cmp_with_zero,
                      _Bool signal_all_nans)

{
  TCGContext_conflict1 *tcg_ctx_00;
  TCGv_i64 retval;
  TCGv_ptr arg3;
  TCGv_i64 arg1;
  TCGv_i32 tcg_dest;
  TCGv_i32 tcg_dest_00;
  TCGv_i32 tcg_vm_1;
  TCGv_i32 tcg_vn_1;
  TCGv_i64 tcg_vm;
  TCGv_i64 tcg_vn;
  TCGv_ptr fpst;
  TCGv_i64 tcg_flags;
  TCGContext_conflict1 *tcg_ctx;
  _Bool signal_all_nans_local;
  _Bool cmp_with_zero_local;
  uint rm_local;
  uint rn_local;
  int size_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  retval = tcg_temp_new_i64(tcg_ctx_00);
  arg3 = get_fpstatus_ptr_aarch64(tcg_ctx_00,size == 1);
  if (size == 3) {
    arg1 = read_fp_dreg(s,rn);
    if (cmp_with_zero) {
      tcg_vn_1 = (TCGv_i32)tcg_const_i64_aarch64(tcg_ctx_00,0);
    }
    else {
      tcg_vn_1 = (TCGv_i32)read_fp_dreg(s,rm);
    }
    if (signal_all_nans) {
      gen_helper_vfp_cmped_a64(tcg_ctx_00,retval,arg1,(TCGv_i64)tcg_vn_1,arg3);
    }
    else {
      gen_helper_vfp_cmpd_a64(tcg_ctx_00,retval,arg1,(TCGv_i64)tcg_vn_1,arg3);
    }
    tcg_temp_free_i64(tcg_ctx_00,arg1);
    tcg_temp_free_i64(tcg_ctx_00,(TCGv_i64)tcg_vn_1);
  }
  else {
    tcg_dest = tcg_temp_new_i32(tcg_ctx_00);
    tcg_dest_00 = tcg_temp_new_i32(tcg_ctx_00);
    read_vec_element_i32(s,tcg_dest,rn,0,size);
    if (cmp_with_zero) {
      tcg_gen_movi_i32(tcg_ctx_00,tcg_dest_00,0);
    }
    else {
      read_vec_element_i32(s,tcg_dest_00,rm,0,size);
    }
    if (size == 1) {
      if (signal_all_nans) {
        gen_helper_vfp_cmpeh_a64(tcg_ctx_00,retval,tcg_dest,tcg_dest_00,arg3);
      }
      else {
        gen_helper_vfp_cmph_a64(tcg_ctx_00,retval,tcg_dest,tcg_dest_00,arg3);
      }
    }
    else {
      if (size != 2) {
        g_assertion_message_expr
                  ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                   ,0x161c,(char *)0x0);
      }
      if (signal_all_nans) {
        gen_helper_vfp_cmpes_a64(tcg_ctx_00,retval,tcg_dest,tcg_dest_00,arg3);
      }
      else {
        gen_helper_vfp_cmps_a64(tcg_ctx_00,retval,tcg_dest,tcg_dest_00,arg3);
      }
    }
    tcg_temp_free_i32(tcg_ctx_00,tcg_dest);
    tcg_temp_free_i32(tcg_ctx_00,tcg_dest_00);
  }
  tcg_temp_free_ptr(tcg_ctx_00,arg3);
  gen_set_nzcv(tcg_ctx_00,retval);
  tcg_temp_free_i64(tcg_ctx_00,retval);
  return;
}

Assistant:

static void handle_fp_compare(DisasContext *s, int size,
                              unsigned int rn, unsigned int rm,
                              bool cmp_with_zero, bool signal_all_nans)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_i64 tcg_flags = tcg_temp_new_i64(tcg_ctx);
    TCGv_ptr fpst = get_fpstatus_ptr(tcg_ctx, size == MO_16);

    if (size == MO_64) {
        TCGv_i64 tcg_vn, tcg_vm;

        tcg_vn = read_fp_dreg(s, rn);
        if (cmp_with_zero) {
            tcg_vm = tcg_const_i64(tcg_ctx, 0);
        } else {
            tcg_vm = read_fp_dreg(s, rm);
        }
        if (signal_all_nans) {
            gen_helper_vfp_cmped_a64(tcg_ctx, tcg_flags, tcg_vn, tcg_vm, fpst);
        } else {
            gen_helper_vfp_cmpd_a64(tcg_ctx, tcg_flags, tcg_vn, tcg_vm, fpst);
        }
        tcg_temp_free_i64(tcg_ctx, tcg_vn);
        tcg_temp_free_i64(tcg_ctx, tcg_vm);
    } else {
        TCGv_i32 tcg_vn = tcg_temp_new_i32(tcg_ctx);
        TCGv_i32 tcg_vm = tcg_temp_new_i32(tcg_ctx);

        read_vec_element_i32(s, tcg_vn, rn, 0, size);
        if (cmp_with_zero) {
            tcg_gen_movi_i32(tcg_ctx, tcg_vm, 0);
        } else {
            read_vec_element_i32(s, tcg_vm, rm, 0, size);
        }

        switch (size) {
        case MO_32:
            if (signal_all_nans) {
                gen_helper_vfp_cmpes_a64(tcg_ctx, tcg_flags, tcg_vn, tcg_vm, fpst);
            } else {
                gen_helper_vfp_cmps_a64(tcg_ctx, tcg_flags, tcg_vn, tcg_vm, fpst);
            }
            break;
        case MO_16:
            if (signal_all_nans) {
                gen_helper_vfp_cmpeh_a64(tcg_ctx, tcg_flags, tcg_vn, tcg_vm, fpst);
            } else {
                gen_helper_vfp_cmph_a64(tcg_ctx, tcg_flags, tcg_vn, tcg_vm, fpst);
            }
            break;
        default:
            g_assert_not_reached();
        }

        tcg_temp_free_i32(tcg_ctx, tcg_vn);
        tcg_temp_free_i32(tcg_ctx, tcg_vm);
    }

    tcg_temp_free_ptr(tcg_ctx, fpst);

    gen_set_nzcv(tcg_ctx, tcg_flags);

    tcg_temp_free_i64(tcg_ctx, tcg_flags);
}